

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int __thiscall ncnn::GRU::forward(GRU *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  float *__src;
  float *__src_00;
  float *__dest;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float *ptr;
  float *pr;
  float *pf;
  int i;
  int ret1;
  int ret0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat hidden;
  int num_directions;
  int T;
  Allocator *in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  Allocator *in_stack_fffffffffffffbb8;
  float _v;
  Mat *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  Mat *in_stack_fffffffffffffbd8;
  int local_3bc;
  Mat *in_stack_fffffffffffffd90;
  Mat *in_stack_fffffffffffffd98;
  Mat *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  Mat *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdd0;
  Option *in_stack_fffffffffffffdd8;
  Mat local_1f8;
  Mat local_1b0 [4];
  int local_8c;
  int local_88;
  Allocator local_78 [9];
  int local_30;
  int local_2c;
  Mat *local_28;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->h;
  local_30 = (*(int *)(in_RDI + 0xd8) == 2) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ncnn::Mat::Mat(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                 (size_t)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
  if (bVar1) {
    local_4 = -100;
    local_88 = 1;
  }
  else {
    ncnn::Mat::fill(in_stack_fffffffffffffbc0,(float)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                      (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(int)in_stack_fffffffffffffbc8
                      ,(size_t)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
    if (bVar1) {
      local_4 = -100;
      local_88 = 1;
    }
    else {
      if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
        ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
        ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
        ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
        in_stack_fffffffffffffba8 = local_78;
        iVar2 = gru(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                    in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                    in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
        ncnn::Mat::~Mat((Mat *)0x90830e);
        ncnn::Mat::~Mat((Mat *)0x90831b);
        ncnn::Mat::~Mat((Mat *)0x908328);
        in_stack_fffffffffffffbb0 = local_28;
        local_8c = iVar2;
        if (iVar2 != 0) {
          local_88 = 1;
          local_4 = iVar2;
          goto LAB_00908962;
        }
      }
      if (*(int *)(in_RDI + 0xd8) == 2) {
        ncnn::Mat::Mat(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                       (int)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0,
                       in_stack_fffffffffffffba8);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
        if (bVar1) {
          local_4 = -100;
          local_88 = 1;
        }
        else {
          ncnn::Mat::Mat(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                         (int)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0,
                         in_stack_fffffffffffffba8);
          _v = (float)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
          bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
          if (bVar1) {
            local_4 = -100;
            local_88 = 1;
          }
          else {
            ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
            ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
            ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
            iVar2 = gru(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                        in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
            ncnn::Mat::~Mat((Mat *)0x9085a2);
            ncnn::Mat::~Mat((Mat *)0x9085af);
            ncnn::Mat::~Mat((Mat *)0x9085bc);
            if (iVar2 == 0) {
              ncnn::Mat::fill(in_stack_fffffffffffffbc0,_v);
              ncnn::Mat::channel(local_18,in_stack_fffffffffffffbd4);
              ncnn::Mat::channel(local_18,in_stack_fffffffffffffbd4);
              ncnn::Mat::channel(local_18,in_stack_fffffffffffffbd4);
              iVar2 = gru(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                          in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                          in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
              ncnn::Mat::~Mat((Mat *)0x90873a);
              ncnn::Mat::~Mat((Mat *)0x908747);
              ncnn::Mat::~Mat((Mat *)0x908754);
              if (iVar2 == 0) {
                for (local_3bc = 0; local_3bc < local_2c; local_3bc = local_3bc + 1) {
                  __src = ncnn::Mat::row(local_1b0,local_3bc);
                  __src_00 = ncnn::Mat::row(&local_1f8,local_3bc);
                  __dest = ncnn::Mat::row(local_20,local_3bc);
                  memcpy(__dest,__src,(long)*(int *)(in_RDI + 0xd0) << 2);
                  memcpy(__dest + *(int *)(in_RDI + 0xd0),__src_00,
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                }
                local_88 = 0;
              }
              else {
                local_88 = 1;
                local_4 = iVar2;
              }
            }
            else {
              local_88 = 1;
              local_4 = iVar2;
            }
          }
          ncnn::Mat::~Mat((Mat *)0x908914);
        }
        ncnn::Mat::~Mat((Mat *)0x908921);
        if (local_88 != 0) goto LAB_00908962;
      }
      local_4 = 0;
      local_88 = 1;
    }
  }
LAB_00908962:
  ncnn::Mat::~Mat((Mat *)0x90896f);
  return local_4;
}

Assistant:

int GRU::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = gru(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = gru(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);

        int ret1 = gru(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}